

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_global_decodeURI(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int isComponent)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  JSValueUnion p_00;
  ulong uVar4;
  void *pvVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int k;
  JSRefCountHeader *p;
  JSValue v;
  int local_60;
  StringBuffer local_50;
  
  v = JS_ToStringInternal(ctx,*argv,0);
  p_00 = v.u;
  uVar6 = (uint)v.tag;
  if (uVar6 != 6) {
    local_50.len = 0;
    local_50.size = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,0,0);
    if (local_50.str == (JSString *)0x0) {
      local_50._16_8_ = local_50._16_8_ & 0xffffffff;
      local_50.error_status = -1;
    }
    uVar4 = *(ulong *)((long)p_00.ptr + 4);
    if ((uVar4 & 0x7fffffff) != 0) {
      iVar7 = 0;
      do {
        if ((int)uVar4 < 0) {
          uVar2 = (uint)*(ushort *)((long)p_00.ptr + (long)iVar7 * 2 + 0x10);
        }
        else {
          uVar2 = (uint)*(byte *)((long)p_00.ptr + (long)iVar7 + 0x10);
        }
        if (uVar2 == 0x25) {
          uVar2 = hex_decode(ctx,(JSString *)p_00.ptr,iVar7);
          if ((int)uVar2 < 0) goto LAB_00165613;
          k = iVar7 + 3;
          if (uVar2 < 0x80) {
            if (isComponent == 0) {
              pvVar5 = memchr(";/?:@&=+$,#",uVar2,0xb);
              if (pvVar5 != (void *)0x0) {
                uVar2 = 0x25;
                k = iVar7 + 1;
              }
            }
            goto LAB_00165515;
          }
          if ((uVar2 & 0x7fffffe0) == 0xc0) {
            local_60 = 0x80;
            iVar7 = 0;
            uVar3 = 0x1f;
LAB_001655a3:
            uVar2 = uVar2 & uVar3;
            iVar7 = iVar7 + 1;
            do {
              uVar3 = uVar2;
              uVar2 = hex_decode(ctx,(JSString *)p_00.ptr,k);
              if ((int)uVar2 < 0) goto LAB_00165613;
              if ((uVar2 & 0xc0) != 0x80) goto LAB_00165602;
              k = k + 3;
              uVar2 = uVar2 & 0x3f | uVar3 << 6;
              iVar8 = iVar7 + -1;
              bVar1 = 0 < iVar7;
              iVar7 = iVar8;
            } while (iVar8 != 0 && bVar1);
            if (((local_60 <= (int)uVar2) && ((int)uVar2 < 0x110000)) &&
               ((uVar3 & 0x3ffffe0) != 0x360)) goto LAB_00165515;
          }
          else {
            if ((uVar2 & 0x7ffffff0) == 0xe0) {
              local_60 = 0x800;
              iVar7 = 1;
              uVar3 = 0xf;
              goto LAB_001655a3;
            }
            if ((uVar2 & 0x7ffffff8) == 0xf0) {
              local_60 = 0x10000;
              iVar7 = 2;
              uVar3 = 7;
              goto LAB_001655a3;
            }
          }
LAB_00165602:
          js_throw_URIError(ctx,"malformed UTF-8");
LAB_00165613:
          if ((0xfffffff4 < uVar6) && (iVar7 = *p_00.ptr, *(int *)p_00.ptr = iVar7 + -1, iVar7 < 2))
          {
            __JS_FreeValueRT(ctx->rt,v);
          }
          (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
          return (JSValue)(ZEXT816(6) << 0x40);
        }
        k = iVar7 + 1;
LAB_00165515:
        iVar7 = k;
        string_buffer_putc(&local_50,uVar2);
        uVar4 = *(ulong *)((long)p_00.ptr + 4);
      } while (iVar7 < (int)((uint)uVar4 & 0x7fffffff));
    }
    if ((0xfffffff4 < uVar6) && (iVar7 = *p_00.ptr, *(int *)p_00.ptr = iVar7 + -1, iVar7 < 2)) {
      __JS_FreeValueRT(ctx->rt,v);
    }
    v = string_buffer_end(&local_50);
  }
  return v;
}

Assistant:

static JSValue js_global_decodeURI(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int isComponent)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int k, c, c1, n, c_min;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    string_buffer_init(ctx, b, 0);

    p = JS_VALUE_GET_STRING(str);
    for (k = 0; k < p->len;) {
        c = string_get(p, k);
        if (c == '%') {
            c = hex_decode(ctx, p, k);
            if (c < 0)
                goto fail;
            k += 3;
            if (c < 0x80) {
                if (!isComponent && isURIReserved(c)) {
                    c = '%';
                    k -= 2;
                }
            } else {
                /* Decode URI-encoded UTF-8 sequence */
                if (c >= 0xc0 && c <= 0xdf) {
                    n = 1;
                    c_min = 0x80;
                    c &= 0x1f;
                } else if (c >= 0xe0 && c <= 0xef) {
                    n = 2;
                    c_min = 0x800;
                    c &= 0xf;
                } else if (c >= 0xf0 && c <= 0xf7) {
                    n = 3;
                    c_min = 0x10000;
                    c &= 0x7;
                } else {
                    n = 0;
                    c_min = 1;
                    c = 0;
                }
                while (n-- > 0) {
                    c1 = hex_decode(ctx, p, k);
                    if (c1 < 0)
                        goto fail;
                    k += 3;
                    if ((c1 & 0xc0) != 0x80) {
                        c = 0;
                        break;
                    }
                    c = (c << 6) | (c1 & 0x3f);
                }
                if (c < c_min || c > 0x10FFFF ||
                    (c >= 0xd800 && c < 0xe000)) {
                    js_throw_URIError(ctx, "malformed UTF-8");
                    goto fail;
                }
            }
        } else {
            k++;
        }
        string_buffer_putc(b, c);
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    JS_FreeValue(ctx, str);
    string_buffer_free(b);
    return JS_EXCEPTION;
}